

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingNonMessage_Test::
~ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingNonMessage_Test
          (ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingNonMessage_Test *this)

{
  ~ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingNonMessage_Test
            ((ExtensionDeclarationsTest_MismatchDotPrefixTypeExpectingNonMessage_Test *)
             &this[-1].super_ExtensionDeclarationsTest.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchDotPrefixTypeExpectingNonMessage) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          extension_range {
            start: 4
            end: 99999
            options: {
              declaration: { number: 10 full_name: ".bar" type: "int32" }
            }
          }
        }
        message_type { name: "int32" }
        extension { name: "bar" number: 10 type_name: "int32" extendee: "Foo" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(error_collector.text_,
            "foo.proto: bar: EXTENDEE: \"Foo\" extension field 10 is expected "
            "to be type \"int32\", not \".int32\".\n");
}